

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiply.hpp
# Opt level: O1

uchar duckdb::MultiplyOperatorOverflowCheck::Operation<unsigned_char,unsigned_char,unsigned_char>
                (uchar left,uchar right)

{
  OutOfRangeException *this;
  PhysicalType type;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  if ((char)((ushort)((ushort)right * (ushort)left) >> 8) == '\0') {
    return (uchar)((ushort)right * (ushort)left);
  }
  this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a0,"Overflow in multiplication of %s (%s * %s)!","");
  TypeIdToString_abi_cxx11_(&local_40,(duckdb *)0x2,type);
  NumericHelper::ToString<unsigned_char>(&local_60,left);
  NumericHelper::ToString<unsigned_char>(&local_80,right);
  OutOfRangeException::
  OutOfRangeException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (this,&local_a0,&local_40,&local_60,&local_80);
  __cxa_throw(this,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static inline TR Operation(TA left, TB right) {
		TR result;
		if (!TryMultiplyOperator::Operation(left, right, result)) {
			throw OutOfRangeException("Overflow in multiplication of %s (%s * %s)!", TypeIdToString(GetTypeId<TA>()),
			                          NumericHelper::ToString(left), NumericHelper::ToString(right));
		}
		return result;
	}